

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O0

void __thiscall
chrono::ChClassRegistrationBase::ChClassRegistrationBase(ChClassRegistrationBase *this)

{
  ChClassRegistrationBase *this_local;
  
  this->_vptr_ChClassRegistrationBase = (_func_int **)&PTR___cxa_pure_virtual_001d76a0;
  return;
}

Assistant:

class ChApi ChClassRegistrationBase {
public:
    /// The signature of create method for derived classes. Calls new().
    virtual void* create() = 0;

    /// Call the ArchiveINconstructor(ChArchiveIn&) function if available (deserializes constructor params and return new()),
    /// otherwise just call new().
    virtual void* create(ChArchiveIn& marchive) = 0;

    /// Get the type_info of the class
    virtual std::type_index  get_type_index() = 0;

    /// Get the name used for registering
    virtual std::string& get_tag_name() = 0;
}